

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O1

ThreadCache * tcmalloc::ThreadCache::NewHeap(void)

{
  ThreadCache *this;
  ThreadCache **ppTVar1;
  bool bVar2;
  SpinLockHolder local_18;
  SpinLockHolder h;
  
  local_18.lock_ = (SpinLock *)(Static::pageheap_ + 8);
  LOCK();
  bVar2 = Static::pageheap_._8_4_ == 0;
  if (bVar2) {
    Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar2) {
    SpinLock::SlowLock((SpinLock *)(Static::pageheap_ + 8));
  }
  this = PageHeapAllocator<tcmalloc::ThreadCache>::New
                   ((PageHeapAllocator<tcmalloc::ThreadCache> *)threadcache_allocator);
  ThreadCache(this);
  this->next_ = thread_heaps_;
  this->prev_ = (ThreadCache *)0x0;
  if (thread_heaps_ == (ThreadCache *)0x0) {
    ppTVar1 = (ThreadCache **)&next_memory_steal_;
  }
  else {
    ppTVar1 = &thread_heaps_->prev_;
  }
  *ppTVar1 = this;
  thread_heap_count_ = thread_heap_count_ + 1;
  thread_heaps_ = this;
  SpinLockHolder::~SpinLockHolder(&local_18);
  return this;
}

Assistant:

ThreadCache* ThreadCache::NewHeap() {
  SpinLockHolder h(Static::pageheap_lock());

  // Create the heap and add it to the linked list
  ThreadCache *heap = new (threadcache_allocator.New()) ThreadCache();

  heap->next_ = thread_heaps_;
  heap->prev_ = nullptr;
  if (thread_heaps_ != nullptr) {
    thread_heaps_->prev_ = heap;
  } else {
    // This is the only thread heap at the momment.
    ASSERT(next_memory_steal_ == nullptr);
    next_memory_steal_ = heap;
  }
  thread_heaps_ = heap;
  thread_heap_count_++;
  return heap;
}